

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall llbuild::ninja::Lexer::lexIdentifier(Lexer *this,Token *result)

{
  bool bVar1;
  int iVar2;
  Token *result_local;
  Lexer *this_local;
  
  while( true ) {
    iVar2 = peekNextChar(this);
    bVar1 = isIdentifierChar((char)iVar2);
    if (!bVar1) break;
    getNextChar(this);
  }
  if (this->mode == IdentifierSpecific) {
    this_local = (Lexer *)setTokenKind(this,result,Identifier);
  }
  else {
    this_local = (Lexer *)setIdentifierTokenKind(this,result);
  }
  return (Token *)this_local;
}

Assistant:

Token& Lexer::lexIdentifier(Token& result) {
  // Consume characters as long as we are in an identifier.
  while (Lexer::isIdentifierChar(peekNextChar())) {
    getNextChar();
  }

  // If we are in identifier specific mode, ignore keywords.
  if (mode == Lexer::LexingMode::IdentifierSpecific)
    return setTokenKind(result, Token::Kind::Identifier);

  // Recognize keywords specially.
  return setIdentifierTokenKind(result);
}